

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkVertexInputRate Diligent::LayoutElemFrequencyToVkInputRate(INPUT_ELEMENT_FREQUENCY frequency)

{
  Char *pCVar1;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  INPUT_ELEMENT_FREQUENCY frequency_local;
  
  msg.field_2._M_local_buf[0xb] = frequency;
  if (frequency == INPUT_ELEMENT_FREQUENCY_UNDEFINED) {
    FormatString<char[35]>((string *)local_30,(char (*) [35])"Undefined layout element frequency");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"LayoutElemFrequencyToVkInputRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x3dc);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 0;
  }
  else if (frequency == INPUT_ELEMENT_FREQUENCY_PER_VERTEX) {
    msg.field_2._12_4_ = 0;
  }
  else if (frequency == INPUT_ELEMENT_FREQUENCY_PER_INSTANCE) {
    msg.field_2._12_4_ = 1;
  }
  else {
    FormatString<char[33]>((string *)local_60,(char (*) [33])"Unknown layout element frequency");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"LayoutElemFrequencyToVkInputRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x3e3);
    std::__cxx11::string::~string((string *)local_60);
    msg.field_2._12_4_ = 0;
  }
  return msg.field_2._12_4_;
}

Assistant:

VkVertexInputRate LayoutElemFrequencyToVkInputRate(INPUT_ELEMENT_FREQUENCY frequency)
{
    switch (frequency)
    {
        case INPUT_ELEMENT_FREQUENCY_UNDEFINED:
            UNEXPECTED("Undefined layout element frequency");
            return VK_VERTEX_INPUT_RATE_VERTEX;

        case INPUT_ELEMENT_FREQUENCY_PER_VERTEX: return VK_VERTEX_INPUT_RATE_VERTEX;
        case INPUT_ELEMENT_FREQUENCY_PER_INSTANCE: return VK_VERTEX_INPUT_RATE_INSTANCE;

        default:
            UNEXPECTED("Unknown layout element frequency");
            return VK_VERTEX_INPUT_RATE_VERTEX;
    }
}